

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  ulong uVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,(uint)data->PropertyIdIndex);
  pPVar6 = ScriptContext::GetPropertyName(this,propertyId);
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  uVar8 = (ulong)(iVar4 - 0x118U);
  if (iVar4 - 0x118U < 0x40) {
    if ((0xc00000000000003U >> (uVar8 & 0x3f) & 1) != 0) {
      bVar1 = data->Instance;
      bVar2 = data->Value;
      form = L" R%d.%s = (Set/Get) R%d";
      goto LAB_007ff8dc;
    }
    if (uVar8 == 0x16) goto LAB_007ff8a0;
    if (uVar8 != 0x3f) goto LAB_007ff897;
  }
  else {
LAB_007ff897:
    if (iVar4 - 0x80U < 4) {
LAB_007ff8a0:
      Output::Print(L" R%d.%s",(ulong)data->Instance,pPVar6 + 1);
      return;
    }
    if (iVar4 != 0xc2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x2d4,"(false)","Unknown OpCode for OpLayoutElementC");
      if (bVar5) {
        *puVar7 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  bVar1 = data->Instance;
  bVar2 = data->Value;
  form = L" R%d.%s = R%d";
LAB_007ff8dc:
  Output::Print(form,(ulong)bVar1,pPVar6 + 1,(ulong)bVar2);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementC(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::DeleteFld:
            case OpCode::DeleteFld_ReuseLoc:
            case OpCode::DeleteRootFld:
            case OpCode::DeleteFldStrict:
            case OpCode::DeleteRootFldStrict:
            {
                Output::Print(_u(" R%d.%s"), data->Instance, pPropertyName->GetBuffer());
                break;
            }
            case OpCode::InitSetFld:
            case OpCode::InitGetFld:
            case OpCode::InitClassMemberGet:
            case OpCode::InitClassMemberSet:
            {
                Output::Print(_u(" R%d.%s = (Set/Get) R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            case OpCode::StFuncExpr:
            case OpCode::InitProto:
            {
                Output::Print(_u(" R%d.%s = R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementC");
                break;
            }
        }
    }